

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

ArgumentMismatch *
CLI::ArgumentMismatch::AtLeast(ArgumentMismatch *__return_storage_ptr__,string *name,int num)

{
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_70,name,": At least ");
  std::__cxx11::to_string(&local_90,num);
  ::std::operator+(&local_50,&local_70,&local_90);
  ::std::operator+(&local_30,&local_50," required");
  ArgumentMismatch(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch AtLeast(std::string name, int num) {
        return ArgumentMismatch(name + ": At least " + std::to_string(num) + " required");
    }